

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

bool __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_node
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this,
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          *node_queue,uint *end_node,task_pool *pTask_pool)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  uint *puVar4;
  bool bVar5;
  float fVar6;
  uint uVar7;
  const_reference pvVar8;
  vq_node *pvVar9;
  vq_node *pvVar10;
  VectorInfo *pVVar11;
  row_vec *prVar12;
  float *pfVar13;
  float *pfVar14;
  vec<16U,_float> *pvVar15;
  bool *pbVar16;
  double *pdVar17;
  VectorInfo *pVVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  float local_b24;
  float local_b1c;
  float local_b04;
  float local_ae4;
  double local_ac0;
  float local_aa0;
  float local_a5c;
  vq_node *right_child_node;
  vq_node *left_child_node;
  NodeInfo local_9fc;
  float local_9f4;
  double dStack_9f0;
  float total_variance;
  double right_dist2;
  double left_dist2;
  VectorInfo *vectorInfo_2;
  VectorInfo *pVStack_9d0;
  uint i_6;
  VectorInfo *vectorInfo_1;
  code *pcStack_9c0;
  uint i_5;
  undefined8 local_9b8;
  uint local_9ac;
  undefined1 *puStack_9a8;
  uint task;
  distance_comparison_task_params params;
  double right_ttsum;
  double left_ttsum;
  vec<16U,_float> new_right_child_1;
  vec<16U,_float> new_left_child_1;
  uint total_loops;
  uint cMaxLoops;
  float right_variance;
  float left_variance;
  float prev_total_variance;
  uint right_info_index;
  uint left_info_index;
  uint64 right_weight;
  uint64 left_weight;
  vec<16U,_float> local_888;
  vec<16U,_float> local_848;
  double local_808;
  double t;
  VectorInfo *pVStack_7f8;
  float weight;
  VectorInfo *vectorInfo;
  double dStack_7e8;
  uint i_4;
  double right_weight_1;
  double left_weight_1;
  vec<16U,_float> new_right_child;
  vec<16U,_float> new_left_child;
  uint j;
  double sum;
  double dStack_740;
  uint i_3;
  double max_sum;
  vec<16U,_float> x_2;
  uint iter;
  vec<16U,_float> axis;
  uint y_1;
  uint x_1;
  float divider;
  uint y;
  uint x;
  vec<16U,_float> w;
  vec<16U,_float> *v_2;
  uint i_2;
  matrix<16U,_16U,_float> covar;
  uint N;
  undefined1 local_1d0 [8];
  vec<16U,_float> right_child;
  undefined1 local_150 [8];
  vec<16U,_float> left_child;
  double dist_1;
  vec<16U,_float> *v_1;
  double dStack_f8;
  uint i_1;
  double opposite_dist;
  vec<16U,_float> opposite;
  double dist;
  vec<16U,_float> *v;
  double dStack_98;
  uint i;
  double furthest_dist;
  vec<16U,_float> furthest;
  uint num_tasks;
  uint num_blocks;
  NodeInfo local_40;
  vq_node *local_38;
  vq_node *parent_node;
  task_pool *pTask_pool_local;
  uint *end_node_local;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  *node_queue_local;
  tree_clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  parent_node = (vq_node *)pTask_pool;
  pTask_pool_local = (task_pool *)end_node;
  end_node_local = (uint *)node_queue;
  node_queue_local =
       (priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        *)this;
  bVar5 = std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          ::empty(node_queue);
  if (bVar5) {
    this_local._7_1_ = false;
  }
  else {
    pvVar8 = std::
             priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
             ::top((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                    *)end_node_local);
    local_38 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                         (&this->m_nodes,pvVar8->m_index);
    if ((local_38->m_alternative & 1U) != 0) {
      local_38->m_alternative = false;
    }
    if ((local_38->m_variance <= 0.0) || (local_38->m_begin + 1 == local_38->m_end)) {
      this_local._7_1_ = false;
    }
    else {
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
             *)end_node_local);
      if ((local_38->m_processed & 1U) == 0) {
        local_38->m_processed = true;
        fVar6 = (float)(local_38->m_end - local_38->m_begin >> 9);
        furthest.m_s[0xf] = fVar6;
        if (((uint)fVar6 < 2) || (parent_node == (vq_node *)0x0)) {
          local_a5c = 1.4013e-45;
        }
        else {
          uVar7 = task_pool::get_num_threads((task_pool *)parent_node);
          local_a5c = (float)math::minimum<unsigned_int>((uint)fVar6,uVar7 + 1);
        }
        furthest.m_s[0xe] = local_a5c;
        vec<16U,_float>::vec((vec<16U,_float> *)&furthest_dist,0.0);
        dStack_98 = -1.0;
        for (v._4_4_ = local_38->m_begin; v._4_4_ < local_38->m_end; v._4_4_ = v._4_4_ + 1) {
          pvVar15 = this->m_vectors;
          pVVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                    operator[](&this->m_vectorsInfo,v._4_4_);
          uVar2 = pVVar11->index;
          fVar6 = vec<16U,_float>::squared_distance(pvVar15 + uVar2,&local_38->m_centroid);
          dVar21 = (double)fVar6;
          opposite.m_s._56_8_ = dVar21;
          if (dStack_98 < dVar21) {
            vec<16U,_float>::operator=((vec<16U,_float> *)&furthest_dist,pvVar15 + uVar2);
            dStack_98 = dVar21;
          }
        }
        vec<16U,_float>::vec((vec<16U,_float> *)&opposite_dist);
        dStack_f8 = -1.0;
        for (v_1._4_4_ = local_38->m_begin; v_1._4_4_ < local_38->m_end; v_1._4_4_ = v_1._4_4_ + 1)
        {
          pvVar15 = this->m_vectors;
          pVVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                    operator[](&this->m_vectorsInfo,v_1._4_4_);
          uVar2 = pVVar11->index;
          fVar6 = vec<16U,_float>::squared_distance
                            (pvVar15 + uVar2,(vec<16U,_float> *)&furthest_dist);
          dVar21 = (double)fVar6;
          left_child.m_s._56_8_ = dVar21;
          if (dStack_f8 < dVar21) {
            vec<16U,_float>::operator=((vec<16U,_float> *)&opposite_dist,pvVar15 + uVar2);
            dStack_f8 = dVar21;
          }
        }
        operator+((vec<16U,_float> *)(right_child.m_s + 0xe),(vec<16U,_float> *)&furthest_dist,
                  &local_38->m_centroid);
        crnlib::operator*((vec<16U,_float> *)local_150,(vec<16U,_float> *)(right_child.m_s + 0xe),
                          0.5);
        operator+((vec<16U,_float> *)(covar.m_rows[0xf].m_s + 0xf),(vec<16U,_float> *)&opposite_dist
                  ,&local_38->m_centroid);
        crnlib::operator*((vec<16U,_float> *)local_1d0,
                          (vec<16U,_float> *)(covar.m_rows[0xf].m_s + 0xf),0.5);
        if (local_38->m_begin + 2 < local_38->m_end) {
          covar.m_rows[0xf].m_s[0xe] = 2.24208e-44;
          matrix<16U,_16U,_float>::matrix((matrix<16U,_16U,_float> *)((long)&v_2 + 4));
          matrix<16U,_16U,_float>::clear((matrix<16U,_16U,_float> *)((long)&v_2 + 4));
          for (v_2._0_4_ = local_38->m_begin; (uint)v_2 < local_38->m_end; v_2._0_4_ = (uint)v_2 + 1
              ) {
            pvVar15 = this->m_vectors;
            pVVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                      operator[](&this->m_vectorsInfo,(uint)v_2);
            pfVar14 = w.m_s + 0xe;
            crnlib::operator-((vec<16U,_float> *)pfVar14,pvVar15 + pVVar11->index,
                              &local_38->m_centroid);
            pVVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                      operator[](&this->m_vectorsInfo,(uint)v_2);
            crnlib::operator*((vec<16U,_float> *)&y,(vec<16U,_float> *)pfVar14,
                              (float)pVVar11->weight);
            for (divider = 0.0; (uint)divider < 0x10; divider = (float)((int)divider + 1)) {
              for (x_1 = (uint)divider; x_1 < 0x10; x_1 = x_1 + 1) {
                prVar12 = matrix<16U,_16U,_float>::operator[]
                                    ((matrix<16U,_16U,_float> *)((long)&v_2 + 4),(uint)divider);
                pfVar13 = vec<16U,_float>::operator[](prVar12,x_1);
                fVar6 = *pfVar13;
                fVar19 = vec<16U,_float>::operator[]((vec<16U,_float> *)pfVar14,(uint)divider);
                fVar20 = vec<16U,_float>::operator[]((vec<16U,_float> *)&y,x_1);
                prVar12 = matrix<16U,_16U,_float>::operator[]
                                    ((matrix<16U,_16U,_float> *)((long)&v_2 + 4),(uint)divider);
                pfVar13 = vec<16U,_float>::operator[](prVar12,x_1);
                *pfVar13 = fVar19 * fVar20 + fVar6;
              }
            }
          }
          local_aa0 = (float)local_38->m_total_weight;
          for (axis.m_s[0xf] = 0.0; (uint)axis.m_s[0xf] < 0x10;
              axis.m_s[0xf] = (float)((int)axis.m_s[0xf] + 1)) {
            for (axis.m_s[0xe] = axis.m_s[0xf]; (uint)axis.m_s[0xe] < 0x10;
                axis.m_s[0xe] = (float)((int)axis.m_s[0xe] + 1)) {
              prVar12 = matrix<16U,_16U,_float>::operator[]
                                  ((matrix<16U,_16U,_float> *)((long)&v_2 + 4),(uint)axis.m_s[0xf]);
              pfVar14 = vec<16U,_float>::operator[](prVar12,(uint)axis.m_s[0xe]);
              *pfVar14 = *pfVar14 / local_aa0;
              prVar12 = matrix<16U,_16U,_float>::operator[]
                                  ((matrix<16U,_16U,_float> *)((long)&v_2 + 4),(uint)axis.m_s[0xf]);
              pfVar14 = vec<16U,_float>::operator[](prVar12,(uint)axis.m_s[0xe]);
              fVar6 = *pfVar14;
              prVar12 = matrix<16U,_16U,_float>::operator[]
                                  ((matrix<16U,_16U,_float> *)((long)&v_2 + 4),(uint)axis.m_s[0xe]);
              pfVar14 = vec<16U,_float>::operator[](prVar12,(uint)axis.m_s[0xf]);
              *pfVar14 = fVar6;
            }
          }
          vec<16U,_float>::vec((vec<16U,_float> *)(x_2.m_s + 0xf),1.0);
          for (x_2.m_s[0xe] = 0.0; (uint)x_2.m_s[0xe] < 10;
              x_2.m_s[0xe] = (float)((int)x_2.m_s[0xe] + 1)) {
            vec<16U,_float>::vec((vec<16U,_float> *)&max_sum);
            dStack_740 = 0.0;
            for (sum._4_4_ = 0; sum._4_4_ < 0x10; sum._4_4_ = sum._4_4_ + 1) {
              stack0xfffffffffffff8b0 = 0.0;
              for (new_left_child.m_s[0xe] = 0.0; (uint)new_left_child.m_s[0xe] < 0x10;
                  new_left_child.m_s[0xe] = (float)((int)new_left_child.m_s[0xe] + 1)) {
                pfVar14 = vec<16U,_float>::operator[]
                                    ((vec<16U,_float> *)(x_2.m_s + 0xf),
                                     (uint)new_left_child.m_s[0xe]);
                fVar6 = *pfVar14;
                prVar12 = matrix<16U,_16U,_float>::operator[]
                                    ((matrix<16U,_16U,_float> *)((long)&v_2 + 4),sum._4_4_);
                pfVar14 = vec<16U,_float>::operator[](prVar12,(uint)new_left_child.m_s[0xe]);
                register0x00001200 = (double)(fVar6 * *pfVar14) + stack0xfffffffffffff8b0;
              }
              pfVar14 = vec<16U,_float>::operator[]((vec<16U,_float> *)&max_sum,sum._4_4_);
              *pfVar14 = (float)stack0xfffffffffffff8b0;
              if (sum._4_4_ == 0) {
                local_ac0 = stack0xfffffffffffff8b0;
              }
              else {
                local_ac0 = math::maximum<double>(dStack_740,stack0xfffffffffffff8b0);
              }
              dStack_740 = local_ac0;
            }
            if ((dStack_740 != 0.0) || (NAN(dStack_740))) {
              vec<16U,_float>::operator*=((vec<16U,_float> *)&max_sum,(float)(1.0 / dStack_740));
            }
            vec<16U,_float>::operator=
                      ((vec<16U,_float> *)(x_2.m_s + 0xf),(vec<16U,_float> *)&max_sum);
          }
          vec<16U,_float>::normalize((vec<16U,_float> *)(x_2.m_s + 0xf),(vec<16U,_float> *)0x0);
          vec<16U,_float>::vec((vec<16U,_float> *)(new_right_child.m_s + 0xe),0.0);
          vec<16U,_float>::vec((vec<16U,_float> *)((long)&left_weight_1 + 4),0.0);
          right_weight_1 = 0.0;
          dStack_7e8 = 0.0;
          for (vectorInfo._4_4_ = local_38->m_begin; vectorInfo._4_4_ < local_38->m_end;
              vectorInfo._4_4_ = vectorInfo._4_4_ + 1) {
            pVStack_7f8 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                          operator[](&this->m_vectorsInfo,vectorInfo._4_4_);
            t._4_4_ = (float)pVStack_7f8->weight;
            crnlib::operator-(&local_848,this->m_vectors + pVStack_7f8->index,&local_38->m_centroid)
            ;
            fVar6 = crnlib::operator*(&local_848,(vec<16U,_float> *)(x_2.m_s + 0xf));
            local_808 = (double)fVar6;
            if (0.0 <= local_808) {
              pvVar15 = vector<crnlib::vec<16U,_float>_>::operator[]
                                  (&this->m_weightedVectors,pVStack_7f8->index);
              vec<16U,_float>::operator+=((vec<16U,_float> *)((long)&left_weight_1 + 4),pvVar15);
              dStack_7e8 = (double)t._4_4_ + dStack_7e8;
            }
            else {
              pvVar15 = vector<crnlib::vec<16U,_float>_>::operator[]
                                  (&this->m_weightedVectors,pVStack_7f8->index);
              vec<16U,_float>::operator+=((vec<16U,_float> *)(new_right_child.m_s + 0xe),pvVar15);
              right_weight_1 = (double)t._4_4_ + right_weight_1;
            }
          }
          if ((0.0 < right_weight_1) && (0.0 < dStack_7e8)) {
            crnlib::operator*(&local_888,(vec<16U,_float> *)(new_right_child.m_s + 0xe),
                              (float)(1.0 / right_weight_1));
            vec<16U,_float>::operator=((vec<16U,_float> *)local_150,&local_888);
            crnlib::operator*((vec<16U,_float> *)&left_weight,
                              (vec<16U,_float> *)((long)&left_weight_1 + 4),
                              (float)(1.0 / dStack_7e8));
            vec<16U,_float>::operator=((vec<16U,_float> *)local_1d0,(vec<16U,_float> *)&left_weight)
            ;
          }
        }
        right_weight = 0;
        _right_info_index = 0;
        prev_total_variance = 0.0;
        right_variance = 1e+10;
        cMaxLoops = 0;
        total_loops = 0;
        for (new_left_child_1.m_s[0xe] = 0.0; (uint)new_left_child_1.m_s[0xe] < 0x400;
            new_left_child_1.m_s[0xe] = (float)((int)new_left_child_1.m_s[0xe] + 1)) {
          left_variance = (float)local_38->m_begin;
          vec<16U,_float>::vec((vec<16U,_float> *)(new_right_child_1.m_s + 0xe),cClear);
          vec<16U,_float>::vec((vec<16U,_float> *)((long)&left_ttsum + 4),cClear);
          right_ttsum = 0.0;
          params.num_tasks = 0;
          params._28_4_ = 0;
          right_weight = 0;
          _right_info_index = 0;
          prev_total_variance = left_variance;
          if ((uint)furthest.m_s[0xe] < 2) {
            for (vectorInfo_2._4_4_ = local_38->m_begin; vectorInfo_2._4_4_ < local_38->m_end;
                vectorInfo_2._4_4_ = vectorInfo_2._4_4_ + 1) {
              left_dist2 = (double)vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>
                                   ::operator[](&this->m_vectorsInfo,vectorInfo_2._4_4_);
              fVar6 = vec<16U,_float>::squared_distance
                                ((vec<16U,_float> *)local_150,
                                 this->m_vectors + ((VectorInfo *)left_dist2)->index);
              right_dist2 = (double)fVar6;
              fVar6 = vec<16U,_float>::squared_distance
                                ((vec<16U,_float> *)local_1d0,this->m_vectors + *(uint *)left_dist2)
              ;
              dStack_9f0 = (double)fVar6;
              if (dStack_9f0 <= right_dist2) {
                pvVar15 = vector<crnlib::vec<16U,_float>_>::operator[]
                                    (&this->m_weightedVectors,*(uint *)left_dist2);
                vec<16U,_float>::operator+=((vec<16U,_float> *)((long)&left_ttsum + 4),pvVar15);
                pdVar17 = vector<double>::operator[]
                                    (&this->m_weightedDotProducts,*(uint *)left_dist2);
                dVar21 = left_dist2;
                params._24_8_ = *pdVar17 + (double)params._24_8_;
                _right_info_index = *(uint *)((long)left_dist2 + 4) + _right_info_index;
                pVVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                          operator[](&this->m_vectorsInfoRight,(uint)left_variance);
                *pVVar11 = *(VectorInfo *)dVar21;
                left_variance = (float)((int)left_variance + 1);
              }
              else {
                pvVar15 = vector<crnlib::vec<16U,_float>_>::operator[]
                                    (&this->m_weightedVectors,*(uint *)left_dist2);
                vec<16U,_float>::operator+=
                          ((vec<16U,_float> *)(new_right_child_1.m_s + 0xe),pvVar15);
                pdVar17 = vector<double>::operator[]
                                    (&this->m_weightedDotProducts,*(uint *)left_dist2);
                dVar21 = left_dist2;
                right_ttsum = *pdVar17 + right_ttsum;
                right_weight = *(uint *)((long)left_dist2 + 4) + right_weight;
                pVVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                          operator[](&this->m_vectorsInfoLeft,(uint)prev_total_variance);
                *pVVar11 = *(VectorInfo *)dVar21;
                prev_total_variance = (float)((int)prev_total_variance + 1);
              }
            }
          }
          else {
            puStack_9a8 = local_150;
            params.left_child = (vec<16U,_float> *)local_1d0;
            params.right_child._0_4_ = local_38->m_begin;
            params.right_child._4_4_ = local_38->m_end;
            params.begin = (uint)furthest.m_s[0xe];
            for (local_9ac = 0; local_9ac < params.begin; local_9ac = local_9ac + 1) {
              pcStack_9c0 = distance_comparison_task;
              local_9b8 = 0;
              task_pool::
              queue_object_task<crnlib::tree_clusterizer<crnlib::vec<16u,float>>,void(crnlib::tree_clusterizer<crnlib::vec<16u,float>>::*)(unsigned_long_long,void*)>
                        ((task_pool *)parent_node,this,0x1f8240,0,(void *)(ulong)local_9ac);
            }
            task_pool::join((task_pool *)parent_node);
            for (vectorInfo_1._4_4_ = local_38->m_begin; vectorInfo_1._4_4_ < local_38->m_end;
                vectorInfo_1._4_4_ = vectorInfo_1._4_4_ + 1) {
              pVStack_9d0 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                            operator[](&this->m_vectorsInfo,vectorInfo_1._4_4_);
              pbVar16 = vector<bool>::operator[](&this->m_vectorComparison,vectorInfo_1._4_4_);
              if ((*pbVar16 & 1U) == 0) {
                pvVar15 = vector<crnlib::vec<16U,_float>_>::operator[]
                                    (&this->m_weightedVectors,pVStack_9d0->index);
                vec<16U,_float>::operator+=((vec<16U,_float> *)((long)&left_ttsum + 4),pvVar15);
                pdVar17 = vector<double>::operator[]
                                    (&this->m_weightedDotProducts,pVStack_9d0->index);
                pVVar11 = pVStack_9d0;
                params._24_8_ = *pdVar17 + (double)params._24_8_;
                _right_info_index = pVStack_9d0->weight + _right_info_index;
                pVVar18 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                          operator[](&this->m_vectorsInfoRight,(uint)left_variance);
                *pVVar18 = *pVVar11;
                left_variance = (float)((int)left_variance + 1);
              }
              else {
                pvVar15 = vector<crnlib::vec<16U,_float>_>::operator[]
                                    (&this->m_weightedVectors,pVStack_9d0->index);
                vec<16U,_float>::operator+=
                          ((vec<16U,_float> *)(new_right_child_1.m_s + 0xe),pvVar15);
                pdVar17 = vector<double>::operator[]
                                    (&this->m_weightedDotProducts,pVStack_9d0->index);
                pVVar11 = pVStack_9d0;
                right_ttsum = *pdVar17 + right_ttsum;
                right_weight = pVStack_9d0->weight + right_weight;
                pVVar18 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                          operator[](&this->m_vectorsInfoLeft,(uint)prev_total_variance);
                *pVVar18 = *pVVar11;
                prev_total_variance = (float)((int)prev_total_variance + 1);
              }
            }
          }
          if ((right_weight == 0) || (_right_info_index == 0)) {
            local_38->m_unsplittable = true;
            return true;
          }
          pfVar14 = new_right_child_1.m_s + 0xe;
          fVar6 = vec<16U,_float>::dot((vec<16U,_float> *)pfVar14,(vec<16U,_float> *)pfVar14);
          uVar3 = params._24_8_;
          local_ae4 = (float)right_weight;
          cMaxLoops = (uint)(float)(right_ttsum - (double)(fVar6 / local_ae4));
          fVar6 = vec<16U,_float>::dot
                            ((vec<16U,_float> *)((long)&left_ttsum + 4),
                             (vec<16U,_float> *)((long)&left_ttsum + 4));
          local_b04 = (float)_right_info_index;
          total_loops = (uint)(float)((double)uVar3 - (double)(fVar6 / local_b04));
          local_b1c = (float)right_weight;
          vec<16U,_float>::operator*=((vec<16U,_float> *)pfVar14,1.0 / local_b1c);
          local_b24 = (float)_right_info_index;
          vec<16U,_float>::operator*=((vec<16U,_float> *)((long)&left_ttsum + 4),1.0 / local_b24);
          vec<16U,_float>::operator=
                    ((vec<16U,_float> *)local_150,(vec<16U,_float> *)(new_right_child_1.m_s + 0xe));
          vec<16U,_float>::operator=
                    ((vec<16U,_float> *)local_1d0,(vec<16U,_float> *)((long)&left_ttsum + 4));
          local_9f4 = (float)cMaxLoops + (float)total_loops;
          if ((local_9f4 < 1e-05) || ((right_variance - local_9f4) / local_9f4 < 1e-05)) break;
          right_variance = local_9f4;
        }
        puVar4 = end_node_local;
        iVar1 = (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock;
        (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock = iVar1 + 1;
        local_38->m_left = iVar1;
        iVar1 = (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock;
        (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock = iVar1 + 1;
        local_38->m_right = iVar1;
        NodeInfo::NodeInfo(&local_9fc,local_38->m_left,(float)cMaxLoops);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                *)puVar4,&local_9fc);
        puVar4 = end_node_local;
        NodeInfo::NodeInfo((NodeInfo *)((long)&left_child_node + 4),local_38->m_right,
                           (float)total_loops);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                *)puVar4,(value_type *)((long)&left_child_node + 4));
        pvVar9 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                           (&this->m_nodes,local_38->m_left);
        pvVar10 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                            (&this->m_nodes,local_38->m_right);
        pvVar9->m_begin = local_38->m_begin;
        pvVar10->m_begin = (uint)prev_total_variance;
        pvVar9->m_end = (uint)prev_total_variance;
        pvVar10->m_end = local_38->m_end;
        pVVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::operator[]
                            (&this->m_vectorsInfo,pvVar9->m_begin);
        pVVar18 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::operator[]
                            (&this->m_vectorsInfoLeft,local_38->m_begin);
        memcpy(pVVar11,pVVar18,(ulong)(pvVar9->m_end - pvVar9->m_begin) << 3);
        pVVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::operator[]
                            (&this->m_vectorsInfo,pvVar10->m_begin);
        pVVar18 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::operator[]
                            (&this->m_vectorsInfoRight,local_38->m_begin);
        memcpy(pVVar11,pVVar18,(ulong)(pvVar10->m_end - pvVar10->m_begin) << 3);
        vec<16U,_float>::operator=(&pvVar9->m_centroid,(vec<16U,_float> *)local_150);
        pvVar9->m_total_weight = right_weight;
        pvVar9->m_variance = (float)cMaxLoops;
        vec<16U,_float>::operator=(&pvVar10->m_centroid,(vec<16U,_float> *)local_1d0);
        pvVar10->m_total_weight = _right_info_index;
        pvVar10->m_variance = (float)total_loops;
        this_local._7_1_ = true;
      }
      else {
        if ((local_38->m_unsplittable & 1U) == 0) {
          pvVar9 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                             (&this->m_nodes,local_38->m_left);
          pvVar10 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                              (&this->m_nodes,(pTask_pool_local->m_task_stack).m_spinlock.m_spinlock
                              );
          vq_node::operator=(pvVar10,pvVar9);
          pvVar9 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                             (&this->m_nodes,(pTask_pool_local->m_task_stack).m_spinlock.m_spinlock)
          ;
          puVar4 = end_node_local;
          pvVar9->m_alternative = true;
          uVar7 = (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock;
          pvVar9 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                             (&this->m_nodes,(pTask_pool_local->m_task_stack).m_spinlock.m_spinlock)
          ;
          NodeInfo::NodeInfo(&local_40,uVar7,pvVar9->m_variance);
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                  *)puVar4,&local_40);
          iVar1 = (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock;
          (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock = iVar1 + 1;
          local_38->m_left = iVar1;
          pvVar9 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                             (&this->m_nodes,local_38->m_right);
          pvVar10 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                              (&this->m_nodes,(pTask_pool_local->m_task_stack).m_spinlock.m_spinlock
                              );
          vq_node::operator=(pvVar10,pvVar9);
          pvVar9 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                             (&this->m_nodes,(pTask_pool_local->m_task_stack).m_spinlock.m_spinlock)
          ;
          puVar4 = end_node_local;
          pvVar9->m_alternative = true;
          uVar7 = (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock;
          pvVar9 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                             (&this->m_nodes,(pTask_pool_local->m_task_stack).m_spinlock.m_spinlock)
          ;
          NodeInfo::NodeInfo((NodeInfo *)&num_tasks,uVar7,pvVar9->m_variance);
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                  *)puVar4,(value_type *)&num_tasks);
          iVar1 = (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock;
          (pTask_pool_local->m_task_stack).m_spinlock.m_spinlock = iVar1 + 1;
          local_38->m_right = iVar1;
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool split_node(std::priority_queue<NodeInfo>& node_queue, uint& end_node, task_pool* pTask_pool = 0)
        {
            if (node_queue.empty())
            {
                return false;
            }

            vq_node& parent_node = m_nodes[node_queue.top().m_index];

            if (parent_node.m_alternative)
            {
                parent_node.m_alternative = false;
            }

            if (parent_node.m_variance <= 0.0f || parent_node.m_begin + 1 == parent_node.m_end)
            {
                return false;
            }

            node_queue.pop();

            if (parent_node.m_processed)
            {
                if (!parent_node.m_unsplittable)
                {
                    m_nodes[end_node] = m_nodes[parent_node.m_left];
                    m_nodes[end_node].m_alternative = true;
                    node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
                    parent_node.m_left = end_node++;
                    m_nodes[end_node] = m_nodes[parent_node.m_right];
                    m_nodes[end_node].m_alternative = true;
                    node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
                    parent_node.m_right = end_node++;
                }
                return true;
            }
            parent_node.m_processed = true;

            uint num_blocks = (parent_node.m_end - parent_node.m_begin) >> 9;
            uint num_tasks = num_blocks > 1 && pTask_pool ? math::minimum(num_blocks, pTask_pool->get_num_threads() + 1) : 1;

            VectorType furthest(0);
            double furthest_dist = -1.0f;

            for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
            {
                const VectorType& v = m_vectors[m_vectorsInfo[i].index];
                double dist = v.squared_distance(parent_node.m_centroid);
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest = v;
                }
            }

            VectorType opposite;
            double opposite_dist = -1.0f;

            for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
            {
                const VectorType& v = m_vectors[m_vectorsInfo[i].index];
                double dist = v.squared_distance(furthest);
                if (dist > opposite_dist)
                {
                    opposite_dist = dist;
                    opposite = v;
                }
            }

            VectorType left_child((furthest + parent_node.m_centroid) * .5f);
            VectorType right_child((opposite + parent_node.m_centroid) * .5f);

            if (parent_node.m_begin + 2 < parent_node.m_end)
            {
                const uint N = VectorType::num_elements;

                matrix<N, N, float> covar;
                covar.clear();

                for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
                {
                    const VectorType& v = m_vectors[m_vectorsInfo[i].index] - parent_node.m_centroid;
                    const VectorType w = v * (float)m_vectorsInfo[i].weight;
                    for (uint x = 0; x < N; x++)
                    {
                        for (uint y = x; y < N; y++)
                        {
                            covar[x][y] = covar[x][y] + v[x] * w[y];
                        }
                    }
                }

                float divider = (float)parent_node.m_total_weight;
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] /= divider;
                        covar[y][x] = covar[x][y];
                    }
                }

                VectorType axis(1.0f);
                // Starting with an estimate of the principle axis should work better, but doesn't in practice?
                //left_child - right_child);
                //axis.normalize();

                for (uint iter = 0; iter < 10; iter++)
                {
                    VectorType x;

                    double max_sum = 0;

                    for (uint i = 0; i < N; i++)
                    {
                        double sum = 0;

                        for (uint j = 0; j < N; j++)
                        {
                            sum += axis[j] * covar[i][j];
                        }

                        x[i] = (float)sum;

                        max_sum = i ? math::maximum(max_sum, sum) : sum;
                    }

                    if (max_sum != 0.0f)
                    {
                        x *= (float)(1.0f / max_sum);
                    }

                    axis = x;
                }

                axis.normalize();

                VectorType new_left_child(0.0f);
                VectorType new_right_child(0.0f);

                double left_weight = 0.0f;
                double right_weight = 0.0f;

                for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
                {
                    const VectorInfo& vectorInfo = m_vectorsInfo[i];
                    const float weight = (float)vectorInfo.weight;
                    double t = (m_vectors[vectorInfo.index] - parent_node.m_centroid) * axis;
                    if (t < 0.0f)
                    {
                        new_left_child += m_weightedVectors[vectorInfo.index];
                        left_weight += weight;
                    }
                    else
                    {
                        new_right_child += m_weightedVectors[vectorInfo.index];
                        right_weight += weight;
                    }
                }

                if ((left_weight > 0.0f) && (right_weight > 0.0f))
                {
                    left_child = new_left_child * (float)(1.0f / left_weight);
                    right_child = new_right_child * (float)(1.0f / right_weight);
                }
            }

            uint64 left_weight = 0;
            uint64 right_weight = 0;

            uint left_info_index = 0;
            uint right_info_index = 0;

            float prev_total_variance = 1e+10f;

            float left_variance = 0.0f;
            float right_variance = 0.0f;

            // FIXME: Excessive upper limit
            const uint cMaxLoops = 1024;
            for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
            {
                left_info_index = right_info_index = parent_node.m_begin;

                VectorType new_left_child(cClear);
                VectorType new_right_child(cClear);

                double left_ttsum = 0.0f;
                double right_ttsum = 0.0f;

                left_weight = 0;
                right_weight = 0;

                if (num_tasks > 1)
                {
                    distance_comparison_task_params params;
                    params.left_child = &left_child;
                    params.right_child = &right_child;
                    params.begin = parent_node.m_begin;
                    params.end = parent_node.m_end;
                    params.num_tasks = num_tasks;

                    for (uint task = 0; task < params.num_tasks; task++)
                    {
                        pTask_pool->queue_object_task(this, &tree_clusterizer::distance_comparison_task, task, &params);
                    }
                    pTask_pool->join();

                    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
                    {
                        const VectorInfo& vectorInfo = m_vectorsInfo[i];
                        if (m_vectorComparison[i])
                        {
                            new_left_child += m_weightedVectors[vectorInfo.index];
                            left_ttsum += m_weightedDotProducts[vectorInfo.index];
                            left_weight += vectorInfo.weight;
                            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
                        }
                        else
                        {
                            new_right_child += m_weightedVectors[vectorInfo.index];
                            right_ttsum += m_weightedDotProducts[vectorInfo.index];
                            right_weight += vectorInfo.weight;
                            m_vectorsInfoRight[right_info_index++] = vectorInfo;
                        }
                    }
                }
                else
                {
                    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
                    {
                        const VectorInfo& vectorInfo = m_vectorsInfo[i];
                        double left_dist2 = left_child.squared_distance(m_vectors[vectorInfo.index]);
                        double right_dist2 = right_child.squared_distance(m_vectors[vectorInfo.index]);
                        if (left_dist2 < right_dist2)
                        {
                            new_left_child += m_weightedVectors[vectorInfo.index];
                            left_ttsum += m_weightedDotProducts[vectorInfo.index];
                            left_weight += vectorInfo.weight;
                            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
                        }
                        else
                        {
                            new_right_child += m_weightedVectors[vectorInfo.index];
                            right_ttsum += m_weightedDotProducts[vectorInfo.index];
                            right_weight += vectorInfo.weight;
                            m_vectorsInfoRight[right_info_index++] = vectorInfo;
                        }
                    }
                }

                if ((!left_weight) || (!right_weight))
                {
                    parent_node.m_unsplittable = true;
                    return true;
                }

                left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
                right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));

                new_left_child *= (1.0f / left_weight);
                new_right_child *= (1.0f / right_weight);

                left_child = new_left_child;
                right_child = new_right_child;

                float total_variance = left_variance + right_variance;
                if (total_variance < .00001f)
                {
                    break;
                }

                if (((prev_total_variance - total_variance) / total_variance) < .00001f)
                {
                    break;
                }

                prev_total_variance = total_variance;
            }

            parent_node.m_left = end_node++;
            parent_node.m_right = end_node++;

            node_queue.push(NodeInfo(parent_node.m_left, left_variance));
            node_queue.push(NodeInfo(parent_node.m_right, right_variance));

            vq_node& left_child_node = m_nodes[parent_node.m_left];
            vq_node& right_child_node = m_nodes[parent_node.m_right];

            left_child_node.m_begin = parent_node.m_begin;
            left_child_node.m_end = right_child_node.m_begin = left_info_index;
            right_child_node.m_end = parent_node.m_end;

            memcpy(&m_vectorsInfo[left_child_node.m_begin], &m_vectorsInfoLeft[parent_node.m_begin], (left_child_node.m_end - left_child_node.m_begin) * sizeof(VectorInfo));
            memcpy(&m_vectorsInfo[right_child_node.m_begin], &m_vectorsInfoRight[parent_node.m_begin], (right_child_node.m_end - right_child_node.m_begin) * sizeof(VectorInfo));

            left_child_node.m_centroid = left_child;
            left_child_node.m_total_weight = left_weight;
            left_child_node.m_variance = left_variance;

            right_child_node.m_centroid = right_child;
            right_child_node.m_total_weight = right_weight;
            right_child_node.m_variance = right_variance;

            return true;
        }